

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

void __thiscall helics::ActionMessage::ActionMessage(ActionMessage *this,ActionMessage *act)

{
  undefined4 *in_RSI;
  SmallBuffer *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000018;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000020;
  SmallBuffer *in_stack_ffffffffffffffe0;
  
  *(undefined4 *)(in_RDI->buffer)._M_elems = *in_RSI;
  *(undefined4 *)((in_RDI->buffer)._M_elems + 4) = in_RSI[1];
  *(undefined4 *)((in_RDI->buffer)._M_elems + 8) = in_RSI[2];
  *(undefined4 *)((in_RDI->buffer)._M_elems + 0xc) = in_RSI[3];
  *(undefined4 *)((in_RDI->buffer)._M_elems + 0x10) = in_RSI[4];
  *(undefined4 *)((in_RDI->buffer)._M_elems + 0x14) = in_RSI[5];
  *(undefined2 *)((in_RDI->buffer)._M_elems + 0x18) = *(undefined2 *)(in_RSI + 6);
  *(undefined2 *)((in_RDI->buffer)._M_elems + 0x1a) = *(undefined2 *)((long)in_RSI + 0x1a);
  *(undefined4 *)((in_RDI->buffer)._M_elems + 0x1c) = in_RSI[7];
  *(undefined8 *)((in_RDI->buffer)._M_elems + 0x20) = *(undefined8 *)(in_RSI + 8);
  *(undefined8 *)((in_RDI->buffer)._M_elems + 0x28) = *(undefined8 *)(in_RSI + 10);
  *(undefined8 *)((in_RDI->buffer)._M_elems + 0x30) = *(undefined8 *)(in_RSI + 0xc);
  *(undefined8 *)((in_RDI->buffer)._M_elems + 0x38) = *(undefined8 *)(in_RSI + 0xe);
  SmallBuffer::SmallBuffer(in_stack_ffffffffffffffe0,in_RDI);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

ActionMessage::ActionMessage(const ActionMessage& act):
    messageAction(act.messageAction), messageID(act.messageID), source_id(act.source_id),
    source_handle(act.source_handle), dest_id(act.dest_id), dest_handle(act.dest_handle),
    counter(act.counter), flags(act.flags), sequenceID(act.sequenceID), actionTime(act.actionTime),
    Te(act.Te), Tdemin(act.Tdemin), Tso(act.Tso), payload(act.payload), stringData(act.stringData)

{
}